

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceOfRevolution::IfcSurfaceOfRevolution
          (IfcSurfaceOfRevolution *this)

{
  IfcSurfaceOfRevolution *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x68,"IfcSurfaceOfRevolution");
  IfcSweptSurface::IfcSweptSurface
            (&this->super_IfcSweptSurface,&PTR_construction_vtable_24__00f02670);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceOfRevolution,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceOfRevolution,_1UL> *)
             &(this->super_IfcSweptSurface).field_0x50,&PTR_construction_vtable_24__00f02720);
  (this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
  super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xf02590;
  *(undefined8 *)&this->field_0x68 = 0xf02658;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xf025b8;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.
    super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xf025e0;
  *(undefined8 *)
   &(this->super_IfcSweptSurface).super_IfcSurface.super_IfcGeometricRepresentationItem.field_0x30 =
       0xf02608;
  *(undefined8 *)&(this->super_IfcSweptSurface).field_0x50 = 0xf02630;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcAxis1Placement>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcAxis1Placement> *)
             &(this->super_IfcSweptSurface).field_0x60,(LazyObject *)0x0);
  return;
}

Assistant:

IfcSurfaceOfRevolution() : Object("IfcSurfaceOfRevolution") {}